

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_set_da_iss(DisasContext_conflict1 *s,MemOp memop,ISSInfo issinfo)

{
  uint32_t syn_00;
  int srt;
  _Bool is_16bit;
  _Bool is_write;
  _Bool is_acqrel;
  _Bool sse;
  int sas;
  uint32_t syn;
  ISSInfo issinfo_local;
  MemOp memop_local;
  DisasContext_conflict1 *s_local;
  
  if (((issinfo & ISSInvalid) == ISSNone) && ((issinfo & ISSRegMask) != 0xf)) {
    syn_00 = syn_data_abort_with_iss
                       (0,memop & MO_64,(uint)((memop & MO_ASHIFT) != MO_8),issinfo & ISSRegMask,0,
                        (uint)((issinfo & ISSIsAcqRel) != ISSNone),0,0,0,
                        (uint)((issinfo & ISSIsWrite) != ISSNone),0,
                        (issinfo & ISSIs16Bit) != ISSNone);
    disas_set_insn_syndrome(s,syn_00);
  }
  return;
}

Assistant:

static void disas_set_da_iss(DisasContext *s, MemOp memop, ISSInfo issinfo)
{
    uint32_t syn;
    int sas = memop & MO_SIZE;
    bool sse = memop & MO_SIGN;
    bool is_acqrel = issinfo & ISSIsAcqRel;
    bool is_write = issinfo & ISSIsWrite;
    bool is_16bit = issinfo & ISSIs16Bit;
    int srt = issinfo & ISSRegMask;

    if (issinfo & ISSInvalid) {
        /* Some callsites want to conditionally provide ISS info,
         * eg "only if this was not a writeback"
         */
        return;
    }

    if (srt == 15) {
        /* For AArch32, insns where the src/dest is R15 never generate
         * ISS information. Catching that here saves checking at all
         * the call sites.
         */
        return;
    }

    syn = syn_data_abort_with_iss(0, sas, sse, srt, 0, is_acqrel,
                                  0, 0, 0, is_write, 0, is_16bit);
    disas_set_insn_syndrome(s, syn);
}